

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O3

Aig_Man_t * Saig_ManTrimPis(Aig_Man_t *p)

{
  int iVar1;
  uint uVar2;
  char *__s;
  void *pvVar3;
  bool bVar4;
  Aig_Man_t *p_00;
  size_t sVar5;
  char *__dest;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Aig_Obj_t *pAVar8;
  ulong uVar9;
  Vec_Ptr_t *pVVar10;
  int iVar11;
  Aig_Obj_t *p1;
  uint uVar12;
  long lVar13;
  
  iVar1 = p->nTruePis;
  bVar4 = false;
  if (0 < (long)iVar1) {
    uVar2 = p->vCis->nSize;
    uVar12 = 0;
    if (0 < (int)uVar2) {
      uVar12 = uVar2;
    }
    if (uVar12 <= iVar1 - 1U) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    bVar4 = true;
    lVar13 = 0;
    do {
      if ((*(uint *)((long)p->vCis->pArray[lVar13] + 0x18) & 0xffffffc0) != 0) {
        bVar4 = false;
      }
      lVar13 = lVar13 + 1;
    } while (iVar1 != lVar13);
    bVar4 = !bVar4;
  }
  p_00 = Aig_ManStart(p->vObjs->nSize - p->nDeleted);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar5 = strlen(__s);
    __dest = (char *)malloc(sVar5 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  p_00->nConstrs = p->nConstrs;
  iVar1 = p->nObjs[2];
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar11 = iVar1;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar11;
  if (iVar11 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar11 << 2);
  }
  pVVar6->pArray = piVar7;
  p_00->vCiNumsOrig = pVVar6;
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  pVVar10 = p->vCis;
  if (0 < pVVar10->nSize) {
    lVar13 = 0;
    do {
      piVar7 = (int *)pVVar10->pArray[lVar13];
      if (((!bVar4) || ((*(ulong *)(piVar7 + 6) & 0xffffffc0) != 0)) ||
         ((((uint)*(ulong *)(piVar7 + 6) & 7) == 2 && (p->nTruePis <= *piVar7)))) {
        pAVar8 = Aig_ObjCreateCi(p_00);
        *(Aig_Obj_t **)(piVar7 + 10) = pAVar8;
        if (p->vCiNumsOrig->nSize <= lVar13) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        Vec_IntPush(p_00->vCiNumsOrig,p->vCiNumsOrig->pArray[lVar13]);
        pVVar10 = p->vCis;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar10->nSize);
  }
  pVVar10 = p->vObjs;
  if (0 < pVVar10->nSize) {
    lVar13 = 0;
    do {
      pvVar3 = pVVar10->pArray[lVar13];
      if ((pvVar3 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar3 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar3 & 1) != 0) goto LAB_006e1094;
        uVar9 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
        if (uVar9 == 0) {
          pAVar8 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar8 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar3 + 8) & 1) ^ *(ulong *)(uVar9 + 0x28));
        }
        uVar9 = *(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe;
        if (uVar9 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar3 + 0x10) & 1) ^ *(ulong *)(uVar9 + 0x28));
        }
        pAVar8 = Aig_And(p_00,pAVar8,p1);
        *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar8;
        pVVar10 = p->vObjs;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar10->nSize);
  }
  pVVar10 = p->vCos;
  if (0 < pVVar10->nSize) {
    lVar13 = 0;
    do {
      pvVar3 = pVVar10->pArray[lVar13];
      if (((ulong)pvVar3 & 1) != 0) {
LAB_006e1094:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar9 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
      if (uVar9 == 0) {
        pAVar8 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar8 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar3 + 8) & 1) ^ *(ulong *)(uVar9 + 0x28));
      }
      pAVar8 = Aig_ObjCreateCo(p_00,pAVar8);
      *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar8;
      lVar13 = lVar13 + 1;
      pVVar10 = p->vCos;
    } while (lVar13 < pVVar10->nSize);
  }
  Aig_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Aig_Man_t * Saig_ManTrimPis( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i, fAllPisHaveNoRefs;
    // check the refs of PIs    
    fAllPisHaveNoRefs = 1;
    Saig_ManForEachPi( p, pObj, i )
        if ( pObj->nRefs )
            fAllPisHaveNoRefs = 0;
    // start the new manager
    pNew = Aig_ManStart( Aig_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->nConstrs = p->nConstrs;
    // start mapping of the CI numbers
    pNew->vCiNumsOrig = Vec_IntAlloc( Aig_ManCiNum(p) );
    // map const and primary inputs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        if ( fAllPisHaveNoRefs || pObj->nRefs || Saig_ObjIsLo(p, pObj) )
        {
            pObj->pData = Aig_ObjCreateCi( pNew );
            Vec_IntPush( pNew->vCiNumsOrig, Vec_IntEntry(p->vCiNumsOrig, i) );
        }
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    Aig_ManForEachCo( p, pObj, i )
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    return pNew;
}